

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_commodities.cpp
# Opt level: O0

void __thiscall
commodities_customDisabled_Test::~commodities_customDisabled_Test
          (commodities_customDisabled_Test *this)

{
  commodities_customDisabled_Test *this_local;
  
  ~commodities_customDisabled_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(commodities, customDisabled)
{
    disableCustomCommodities();
    addCustomCommodity("unit_tests", 26262352U);
    auto c = getCommodity("unit_tests");
    EXPECT_NE(c, 26262352U);
    enableCustomCommodities();
    addCustomCommodity("unit_tests", 26262352U);
    c = getCommodity("unit_tests");
    EXPECT_EQ(c, 26262352U);
    clearCustomCommodities();
}